

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_list_graph.c
# Opt level: O2

ClgGraph createClgGraph(Vertices vertices,Edges edges,int countOfVertex,int countOfEdge,
                       GraphKind kind)

{
  ClgGraph pCVar1;
  _Bool weightFlag;
  
  if (kind == DN) {
    weightFlag = true;
  }
  else {
    if (kind != DG) {
      return (ClgGraph)0x0;
    }
    weightFlag = false;
  }
  pCVar1 = createGraph_CLG(vertices,edges,countOfVertex,countOfEdge,weightFlag);
  if (pCVar1 == (ClgGraph)0x0) {
    return (ClgGraph)0x0;
  }
  pCVar1->kind = kind;
  return pCVar1;
}

Assistant:

ClgGraph createClgGraph(Vertices vertices, Edges edges, int countOfVertex, int countOfEdge, GraphKind kind) {
    ClgGraph clgGraph = NULL;
    switch (kind) {
        case DG:
            clgGraph = createGraph_CLG(vertices, edges, countOfVertex, countOfEdge, false);
            if (clgGraph)
                clgGraph->kind = DG;
            return clgGraph;
        case DN:
            clgGraph = createGraph_CLG(vertices, edges, countOfVertex, countOfEdge, true);
            if (clgGraph)
                clgGraph->kind = DN;
            return clgGraph;
        default:
            return NULL;
    }

}